

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall
Lowerer::LowerProfileLdSlot
          (Lowerer *this,Opnd *valueOpnd,Func *ldSlotFunc,ProfileId profileId,
          Instr *insertBeforeInstr)

{
  LowererMD *this_00;
  Func *func;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  IntConstOpnd *opndArg;
  AddrOpnd *opndArg_00;
  Instr *this_01;
  HelperCallOpnd *newSrc;
  
  if (valueOpnd == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2b7d,"(valueOpnd)","valueOpnd");
    if (!bVar2) goto LAB_0055bd51;
    *puVar3 = 0;
  }
  if (profileId == 0xffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2b7e,"(profileId != Js::Constants::NoProfileId)",
                       "profileId != Js::Constants::NoProfileId");
    if (!bVar2) goto LAB_0055bd51;
    *puVar3 = 0;
  }
  if (insertBeforeInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2b7f,"(insertBeforeInstr)","insertBeforeInstr");
    if (!bVar2) {
LAB_0055bd51:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  func = insertBeforeInstr->m_func;
  this_00 = &this->m_lowererMD;
  opndArg = IR::Opnd::CreateProfileIdOpnd(profileId,func);
  LowererMD::LoadHelperArgument(this_00,insertBeforeInstr,&opndArg->super_Opnd);
  opndArg_00 = CreateFunctionBodyOpnd(this,ldSlotFunc);
  LowererMD::LoadHelperArgument(this_00,insertBeforeInstr,&opndArg_00->super_Opnd);
  LowererMD::LoadHelperArgument(this_00,insertBeforeInstr,valueOpnd);
  this_01 = IR::Instr::New(Call,func);
  newSrc = IR::HelperCallOpnd::New(HelperProfileLdSlot,func);
  IR::Instr::SetSrc1(this_01,&newSrc->super_Opnd);
  IR::Instr::InsertBefore(insertBeforeInstr,this_01);
  LowererMD::LowerCall(this_00,this_01,0);
  return;
}

Assistant:

void Lowerer::LowerProfileLdSlot(IR::Opnd *const valueOpnd, Func *const ldSlotFunc, const Js::ProfileId profileId, IR::Instr *const insertBeforeInstr)
{
    Assert(valueOpnd);
    Assert(profileId != Js::Constants::NoProfileId);
    Assert(insertBeforeInstr);

    Func *const irFunc = insertBeforeInstr->m_func;

    m_lowererMD.LoadHelperArgument(insertBeforeInstr, IR::Opnd::CreateProfileIdOpnd(profileId, irFunc));
    m_lowererMD.LoadHelperArgument(insertBeforeInstr, CreateFunctionBodyOpnd(ldSlotFunc));
    m_lowererMD.LoadHelperArgument(insertBeforeInstr, valueOpnd);

    IR::Instr *const callInstr = IR::Instr::New(Js::OpCode::Call, irFunc);
    callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::HelperProfileLdSlot, irFunc));
    insertBeforeInstr->InsertBefore(callInstr);
    m_lowererMD.LowerCall(callInstr, 0);
}